

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BufferBuilder.h
# Opt level: O3

uint32 __thiscall Js::BufferBuilderAligned::FixOffset(BufferBuilderAligned *this,uint32 offset)

{
  uint uVar1;
  code *pcVar2;
  bool bVar3;
  uint32 uVar4;
  undefined4 *puVar5;
  uint uVar6;
  uint uVar7;
  
  (this->super_BufferBuilder).offset = offset;
  uVar1 = this->alignment;
  uVar7 = -uVar1 & (offset + uVar1) - 1;
  uVar6 = uVar7 - offset;
  this->padding = uVar6;
  if (uVar1 <= uVar6) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar5 = 1;
    bVar3 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/DataStructures/BufferBuilder.h"
                                ,0x151,"(this->padding < this->alignment)",
                                "this->padding < this->alignment");
    if (!bVar3) {
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  uVar4 = (**this->content->_vptr_BufferBuilder)(this->content,(ulong)uVar7);
  return uVar4;
}

Assistant:

uint32 FixOffset(uint32 offset) override
        {
            this->offset = offset;

            // Calculate padding
            offset = ::Math::Align(this->offset, this->alignment);
            this->padding = offset - this->offset;
            Assert(this->padding < this->alignment);

            return content->FixOffset(offset);
        }